

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

HelicsBool helicsCoreConnect(HelicsCore core,HelicsError *err)

{
  element_type *peVar1;
  uint uVar2;
  CoreObject *pCVar3;
  
  pCVar3 = helics::getCoreObject(core,err);
  uVar2 = 0;
  if ((pCVar3 != (CoreObject *)0x0) &&
     (peVar1 = (pCVar3->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     , uVar2 = 0, peVar1 != (element_type *)0x0)) {
    uVar2 = (*peVar1->_vptr_Core[6])();
    uVar2 = uVar2 & 0xff;
  }
  return uVar2;
}

Assistant:

HelicsBool helicsCoreConnect(HelicsCore core, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return HELICS_FALSE;
    }

    try {
        return (cppcore->connect()) ? HELICS_TRUE : HELICS_FALSE;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}